

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_call_arity_tests.cpp
# Opt level: O0

void __thiscall
GenericExceptionCatcher_Call_Arity_Tests::generic_catcher_2_param_with_multiple_nested_handlers_0::
test_method(generic_catcher_2_param_with_multiple_nested_handlers_0 *this)

{
  undefined7 uVar1;
  GenericExceptionHandler<float,_mittens::UnHandler<int>,_mittens::DefaultNoAction<float>_> GVar2;
  GenericExceptionHandler<MyException1,_mittens::UnHandler<int>,_mittens::DefaultNoAction<MyException1>_>
  GVar3;
  undefined1 in_R9B;
  GenericExceptionHandler<int,_mittens::GenericExceptionHandler<float,_mittens::UnHandler<int>,_mittens::DefaultNoAction<float>_>,_mittens::DefaultNoAction<int>_>
  GVar4;
  GenericExceptionHandler<int,_mittens::GenericExceptionHandler<MyException1,_mittens::UnHandler<int>,_mittens::DefaultNoAction<MyException1>_>,_mittens::DefaultNoAction<int>_>
  GVar5;
  GenericExceptionHandler<int,_mittens::GenericExceptionHandler<float,_mittens::UnHandler<int>,_mittens::DefaultNoAction<float>_>,_mittens::DefaultNoAction<int>_>
  func;
  GenericExceptionHandler<int,_mittens::GenericExceptionHandler<MyException1,_mittens::UnHandler<int>,_mittens::DefaultNoAction<MyException1>_>,_mittens::DefaultNoAction<int>_>
  func_00;
  undefined1 uStack_e9;
  undefined6 uStack_e0;
  undefined2 uStack_da;
  undefined1 local_d8 [8];
  GenericExceptionHandler<void,_mittens::GenericExceptionHandler<int,_mittens::GenericExceptionHandler<MyException1,_mittens::UnHandler<int>,_mittens::DefaultNoAction<MyException1>_>,_mittens::DefaultNoAction<int>_>,_mittens::DefaultNoAction<void>_>
  catcher_1;
  undefined1 uStack_39;
  undefined6 uStack_30;
  undefined2 uStack_2a;
  undefined1 local_28 [8];
  GenericExceptionHandler<void,_mittens::GenericExceptionHandler<int,_mittens::GenericExceptionHandler<float,_mittens::UnHandler<int>,_mittens::DefaultNoAction<float>_>,_mittens::DefaultNoAction<int>_>,_mittens::DefaultNoAction<void>_>
  catcher;
  generic_catcher_2_param_with_multiple_nested_handlers_0 *this_local;
  
  catcher._16_8_ = this;
  GVar2 = mittens::generic_handler<float,int>(-3);
  uVar1 = GVar2._0_7_;
  GVar2._7_1_ = uStack_39;
  GVar2.failCode_ = (int)uVar1;
  GVar2._4_2_ = (short)((uint7)uVar1 >> 0x20);
  GVar2.supressExceptionsInAction_ = (bool)(char)((uint7)uVar1 >> 0x30);
  GVar4 = mittens::
          generic_handler<int,mittens::GenericExceptionHandler<float,mittens::UnHandler<int>,mittens::DefaultNoAction<float>>,int>
                    (-2,GVar2,true);
  uStack_30 = GVar4._8_6_;
  func.nestedHandler.failCode_._2_2_ = uStack_2a;
  func._0_6_ = uStack_30;
  func.nestedHandler._4_4_ = 1;
  func._12_4_ = 0;
  mittens::
  generic_handler<void,mittens::GenericExceptionHandler<int,mittens::GenericExceptionHandler<float,mittens::UnHandler<int>,mittens::DefaultNoAction<float>>,mittens::DefaultNoAction<int>>,int>
            ((GenericExceptionHandler<void,_mittens::GenericExceptionHandler<int,_mittens::GenericExceptionHandler<float,_mittens::UnHandler<int>,_mittens::DefaultNoAction<float>_>,_mittens::DefaultNoAction<int>_>,_mittens::DefaultNoAction<void>_>
              *)local_28,(mittens *)0xffffffff,GVar4.failCode_,func,(bool)in_R9B);
  throw_int(0);
  GVar3 = mittens::
          generic_handler<GenericExceptionCatcher_Call_Arity_Tests::generic_catcher_2_param_with_multiple_nested_handlers_0::test_method()::MyException1,int>
                    (-3);
  uVar1 = GVar3._0_7_;
  GVar3._7_1_ = uStack_e9;
  GVar3.failCode_ = (int)uVar1;
  GVar3._4_2_ = (short)((uint7)uVar1 >> 0x20);
  GVar3.supressExceptionsInAction_ = (bool)(char)((uint7)uVar1 >> 0x30);
  GVar5 = mittens::
          generic_handler<int,mittens::GenericExceptionHandler<GenericExceptionCatcher_Call_Arity_Tests::generic_catcher_2_param_with_multiple_nested_handlers_0::test_method()::MyException1,mittens::UnHandler<int>,mittens::DefaultNoAction<GenericExceptionCatcher_Call_Arity_Tests::generic_catcher_2_param_with_multiple_nested_handlers_0::test_method()::MyException1>>,int>
                    (-2,GVar3,true);
  uStack_e0 = GVar5._8_6_;
  func_00.nestedHandler.failCode_._2_2_ = uStack_da;
  func_00._0_6_ = uStack_e0;
  func_00.nestedHandler._4_4_ = 1;
  func_00._12_4_ = 0;
  mittens::
  all_catcher<mittens::GenericExceptionHandler<int,mittens::GenericExceptionHandler<GenericExceptionCatcher_Call_Arity_Tests::generic_catcher_2_param_with_multiple_nested_handlers_0::test_method()::MyException1,mittens::UnHandler<int>,mittens::DefaultNoAction<GenericExceptionCatcher_Call_Arity_Tests::generic_catcher_2_param_with_multiple_nested_handlers_0::test_method()::MyException1>>,mittens::DefaultNoAction<int>>,int>
            ((GenericExceptionHandler<void,_mittens::GenericExceptionHandler<int,_mittens::GenericExceptionHandler<MyException1,_mittens::UnHandler<int>,_mittens::DefaultNoAction<MyException1>_>,_mittens::DefaultNoAction<int>_>,_mittens::DefaultNoAction<void>_>
              *)local_d8,(mittens *)0xffffffff,GVar5.failCode_,func_00,(bool)in_R9B);
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_2_param_with_multiple_nested_handlers_0)
{
   using namespace mittens;

   {
      auto catcher = generic_handler<void>(-1,
                        generic_handler<int>(-2,
                           generic_handler<float>(-3)));

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(-2, catcher.handleException());
      }
   }

   {
      struct MyException1 { };
      auto catcher = all_catcher(-1,
                        generic_handler<int>(-2,
                           generic_handler<MyException1>(-3)));

      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(-2, catcher.handleException());
      }
   }
}